

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t allocate_and_set_string(char *src,char *default_src,char **dst,char *err_detail)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  char *in_RCX;
  long *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *tmp;
  size_t len;
  void *in_stack_ffffffffffffffd0;
  
  if (in_RDI == (char *)0x0) {
    snprintf(in_RCX,200,"Null pointer given to a string parameter.");
    return AOM_CODEC_INVALID_PARAM;
  }
  if ((*in_RDX != 0) && (iVar1 = strcmp(in_RDI,(char *)*in_RDX), iVar1 == 0)) {
    return AOM_CODEC_OK;
  }
  if ((char *)*in_RDX != in_RSI) {
    aom_free(in_stack_ffffffffffffffd0);
  }
  if ((in_RSI == (char *)0x0) || (iVar1 = strcmp(in_RDI,in_RSI), iVar1 != 0)) {
    sVar2 = strlen(in_RDI);
    sVar2 = sVar2 + 1;
    __dest = aom_malloc(0x1e933c);
    if (__dest == (void *)0x0) {
      snprintf(in_RCX,200,"Failed to allocate memory for copying parameters.");
      return AOM_CODEC_MEM_ERROR;
    }
    memcpy(__dest,in_RDI,sVar2);
    *in_RDX = (long)__dest;
  }
  else {
    *in_RDX = (long)in_RSI;
  }
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t allocate_and_set_string(const char *src,
                                               const char *default_src,
                                               const char **dst,
                                               char *err_detail) {
  if (!src) {
    snprintf(err_detail, ARG_ERR_MSG_MAX_LEN,
             "Null pointer given to a string parameter.");
    return AOM_CODEC_INVALID_PARAM;
  }
  if (*dst && strcmp(src, *dst) == 0) return AOM_CODEC_OK;
  // If the input is exactly the same as default, we will use the string
  // literal, so do not free here.
  if (*dst != default_src) {
    aom_free((void *)*dst);
  }

  if (default_src && strcmp(src, default_src) == 0) {
    // default_src should be a string literal
    *dst = default_src;
  } else {
    size_t len = strlen(src) + 1;
    char *tmp = aom_malloc(len * sizeof(*tmp));
    if (!tmp) {
      snprintf(err_detail, ARG_ERR_MSG_MAX_LEN,
               "Failed to allocate memory for copying parameters.");
      return AOM_CODEC_MEM_ERROR;
    }
    memcpy(tmp, src, len);
    *dst = tmp;
  }
  return 0;
}